

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_do(Curl_easy *data,_Bool *done)

{
  curl_mimepart *part;
  uint *puVar1;
  IMAP *pIVar2;
  connectdata *conn;
  FILEPROTO *pFVar3;
  connectdata *pcVar4;
  bool bVar5;
  _Bool _Var6;
  CURLcode CVar7;
  int iVar8;
  CURLcode CVar9;
  uint uVar10;
  curl_off_t cVar11;
  long lVar12;
  CURLcode unaff_EBP;
  char *pcVar13;
  size_t sVar14;
  char *pcVar15;
  Curl_easy *data_00;
  char *pcVar16;
  char *value;
  char *name;
  char *local_70;
  Curl_easy *local_68;
  size_t local_60;
  _Bool *local_58;
  dynbuf local_50;
  
  *done = false;
  pIVar2 = (data->req).p.imap;
  pcVar15 = (data->state).up.path;
  lVar12 = 1;
  pcVar16 = pcVar15;
  local_68 = data;
  local_58 = done;
  do {
    pcVar13 = pcVar16;
    pcVar16 = pcVar13 + 1;
    _Var6 = imap_is_bchar(pcVar13[1]);
    lVar12 = lVar12 + -1;
  } while (_Var6);
  if (lVar12 == 0) {
    pIVar2->mailbox = (char *)0x0;
LAB_0013f57a:
    while (*pcVar16 == ';') {
      pcVar15 = pcVar16 + 1;
      sVar14 = 0;
      pcVar16 = pcVar15;
LAB_0013f591:
      if (*pcVar16 == '\0') goto LAB_0013f6d9;
      if (*pcVar16 != '=') goto code_r0x0013f5a3;
      bVar5 = false;
      CVar7 = Curl_urldecode(pcVar15,sVar14,&local_50.bufr,(size_t *)0x0,REJECT_CTRL);
      if (CVar7 != CURLE_OK) goto LAB_0013f6e0;
      pcVar15 = pcVar16 + 1;
      sVar14 = 0xffffffffffffffff;
      do {
        pcVar13 = pcVar16 + 1;
        pcVar16 = pcVar16 + 1;
        _Var6 = imap_is_bchar(*pcVar13);
        sVar14 = sVar14 + 1;
      } while (_Var6);
      CVar7 = Curl_urldecode(pcVar15,sVar14,&local_70,&local_60,REJECT_CTRL);
      if (CVar7 == CURLE_OK) {
        iVar8 = curl_strequal(local_50.bufr,"UIDVALIDITY");
        if ((iVar8 == 0) || (pIVar2->uidvalidity != (char *)0x0)) {
          iVar8 = curl_strequal(local_50.bufr,"UID");
          if ((iVar8 == 0) || (pIVar2->uid != (char *)0x0)) {
            iVar8 = curl_strequal(local_50.bufr,"MAILINDEX");
            if ((iVar8 == 0) || (pIVar2->mindex != (char *)0x0)) {
              iVar8 = curl_strequal(local_50.bufr,"SECTION");
              if ((iVar8 == 0) || (pIVar2->section != (char *)0x0)) {
                iVar8 = curl_strequal(local_50.bufr,"PARTIAL");
                if ((iVar8 == 0) || (pIVar2->partial != (char *)0x0)) {
                  (*Curl_cfree)(local_50.bufr);
                  (*Curl_cfree)(local_70);
LAB_0013f6d9:
                  bVar5 = false;
                  CVar7 = CURLE_URL_MALFORMAT;
                  goto LAB_0013f6e0;
                }
                if ((local_60 != 0) && (local_70[local_60 - 1] == '/')) {
                  local_70[local_60 - 1] = '\0';
                }
                pIVar2->partial = local_70;
              }
              else {
                if ((local_60 != 0) && (local_70[local_60 - 1] == '/')) {
                  local_70[local_60 - 1] = '\0';
                }
                pIVar2->section = local_70;
              }
            }
            else {
              if ((local_60 != 0) && (local_70[local_60 - 1] == '/')) {
                local_70[local_60 - 1] = '\0';
              }
              pIVar2->mindex = local_70;
            }
          }
          else {
            if ((local_60 != 0) && (local_70[local_60 - 1] == '/')) {
              local_70[local_60 - 1] = '\0';
            }
            pIVar2->uid = local_70;
          }
        }
        else {
          if ((local_60 != 0) && (local_70[local_60 - 1] == '/')) {
            local_70[local_60 - 1] = '\0';
          }
          pIVar2->uidvalidity = local_70;
        }
        local_70 = (char *)0x0;
        (*Curl_cfree)(local_50.bufr);
        (*Curl_cfree)(local_70);
        bVar5 = true;
        CVar7 = unaff_EBP;
      }
      else {
        (*Curl_cfree)(local_50.bufr);
        bVar5 = false;
      }
LAB_0013f6e0:
      unaff_EBP = CVar7;
      if (!bVar5) goto LAB_0013f817;
    }
    if (((pIVar2->mailbox != (char *)0x0) && (pIVar2->uid == (char *)0x0)) &&
       (pIVar2->mindex == (char *)0x0)) {
      curl_url_get((local_68->state).uh,CURLUPART_QUERY,&pIVar2->query,0x40);
    }
    unaff_EBP = (uint)(*pcVar16 != '\0') * 3;
  }
  else {
    pcVar15 = pcVar15 + 1;
    if (*pcVar13 != '/') {
      pcVar13 = pcVar16;
    }
    unaff_EBP = Curl_urldecode(pcVar15,(long)pcVar13 - (long)pcVar15,&pIVar2->mailbox,(size_t *)0x0,
                               REJECT_CTRL);
    if (unaff_EBP == CURLE_OK) goto LAB_0013f57a;
  }
LAB_0013f817:
  data_00 = local_68;
  if (unaff_EBP != CURLE_OK) {
    return unaff_EBP;
  }
  pcVar15 = (local_68->set).str[0x1c];
  if (pcVar15 == (char *)0x0) {
LAB_0013f873:
    CVar7 = CURLE_OK;
  }
  else {
    pIVar2 = (local_68->req).p.imap;
    CVar7 = Curl_urldecode(pcVar15,0,&pIVar2->custom,(size_t *)0x0,REJECT_CTRL);
    if (CVar7 == CURLE_OK) {
      pcVar15 = pIVar2->custom;
      pcVar16 = pcVar15;
      for (; *pcVar15 != '\0'; pcVar15 = pcVar15 + 1) {
        if (*pcVar15 == ' ') {
          pcVar15 = (*Curl_cstrdup)(pcVar15);
          pIVar2->custom_params = pcVar15;
          *pcVar16 = '\0';
          CVar7 = CURLE_OUT_OF_MEMORY;
          if (pIVar2->custom_params != (char *)0x0) {
            CVar7 = CURLE_OK;
          }
          goto LAB_0013f875;
        }
        pcVar16 = pcVar16 + 1;
      }
      goto LAB_0013f873;
    }
  }
LAB_0013f875:
  if (CVar7 != CURLE_OK) {
    return CVar7;
  }
  (data_00->req).size = -1;
  Curl_pgrsSetUploadCounter(data_00,0);
  Curl_pgrsSetDownloadCounter(data_00,0);
  Curl_pgrsSetUploadSize(data_00,-1);
  Curl_pgrsSetDownloadSize(data_00,-1);
  conn = data_00->conn;
  pIVar2 = (data_00->req).p.imap;
  if (((data_00->req).field_0xd3 & 2) != 0) {
    pIVar2->transfer = PPTRANSFER_INFO;
  }
  *local_58 = false;
  if ((((pIVar2->mailbox == (char *)0x0) ||
       (pcVar15 = (conn->proto).imapc.mailbox, pcVar15 == (char *)0x0)) ||
      (iVar8 = curl_strequal(pIVar2->mailbox,pcVar15), iVar8 == 0)) ||
     (((pIVar2->uidvalidity != (char *)0x0 &&
       (pcVar15 = (conn->proto).ftpc.server_os, pcVar15 != (char *)0x0)) &&
      (iVar8 = curl_strequal(pIVar2->uidvalidity,pcVar15), iVar8 == 0)))) {
    bVar5 = false;
  }
  else {
    bVar5 = true;
  }
  if ((((data_00->state).field_0x7c0 & 8) == 0) && ((data_00->set).mimepost.kind == MIMEKIND_NONE))
  {
    pcVar15 = pIVar2->custom;
    if ((pcVar15 == (char *)0x0) || ((!bVar5 && (pIVar2->mailbox != (char *)0x0)))) {
      if (bVar5 && pcVar15 == (char *)0x0) {
        if ((pIVar2->uid != (char *)0x0) || (pIVar2->mindex != (char *)0x0)) {
          CVar7 = imap_perform_fetch(data_00);
          goto LAB_0013fc6f;
        }
        if (pIVar2->query != (char *)0x0) {
          CVar7 = imap_perform_search(data_00);
          goto LAB_0013fc6f;
        }
      }
      if ((!bVar5 && pIVar2->mailbox != (char *)0x0) &&
         ((((pcVar15 != (char *)0x0 || (pIVar2->uid != (char *)0x0)) ||
           (pIVar2->mindex != (char *)0x0)) || (pIVar2->query != (char *)0x0)))) {
        pcVar4 = data_00->conn;
        pFVar3 = (data_00->req).p.file;
        (*Curl_cfree)((pcVar4->proto).imapc.mailbox);
        (pcVar4->proto).ftpc.retr_size_saved = 0;
        (*Curl_cfree)((pcVar4->proto).ftpc.server_os);
        (pcVar4->proto).ftpc.server_os = (char *)0x0;
        pcVar15 = pFVar3->freepath;
        if (pcVar15 == (char *)0x0) {
          Curl_failf(data_00,"Cannot SELECT without a mailbox.");
          CVar7 = CURLE_URL_MALFORMAT;
        }
        else {
          pcVar15 = imap_atom(pcVar15,false);
          data_00 = local_68;
          if (pcVar15 == (char *)0x0) {
            CVar7 = CURLE_OUT_OF_MEMORY;
          }
          else {
            CVar7 = imap_sendf(local_68,"SELECT %s",pcVar15);
            (*Curl_cfree)(pcVar15);
            if (CVar7 == CURLE_OK) {
              (data_00->conn->proto).imapc.state = IMAP_SELECT;
            }
          }
        }
        goto LAB_0013fc6f;
      }
    }
    CVar7 = imap_perform_list(data_00);
    goto LAB_0013fc6f;
  }
  pFVar3 = (data_00->req).p.file;
  if (pFVar3->freepath == (char *)0x0) {
    Curl_failf(data_00,"Cannot APPEND without a mailbox.");
    CVar7 = CURLE_URL_MALFORMAT;
    goto LAB_0013fc6f;
  }
  if ((data_00->set).mimepost.kind == MIMEKIND_NONE) {
    CVar7 = Curl_creader_set_fread(data_00,(data_00->state).infilesize);
    if (CVar7 != CURLE_OK) goto LAB_0013fc6f;
  }
  else {
    part = &(data_00->set).mimepost;
    puVar1 = &(data_00->set).mimepost.flags;
    *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
    curl_mime_headers(part,(data_00->set).headers,0);
    CVar7 = Curl_mime_prepare_headers(data_00,part,(char *)0x0,(char *)0x0,MIMESTRATEGY_MAIL);
    if (CVar7 == CURLE_OK) {
      pcVar15 = Curl_checkheaders(data_00,"Mime-Version",0xc);
      CVar7 = CURLE_OK;
      if (pcVar15 == (char *)0x0) {
        CVar7 = Curl_mime_add_header(&(data_00->set).mimepost.curlheaders,"Mime-Version: 1.0");
      }
    }
    if (CVar7 == CURLE_OK) {
      CVar7 = Curl_creader_set_mime(data_00,part);
    }
    if (CVar7 != CURLE_OK) goto LAB_0013fc6f;
    cVar11 = Curl_creader_client_length(data_00);
    (data_00->state).infilesize = cVar11;
  }
  if ((data_00->state).infilesize < 0) {
    Curl_failf(data_00,"Cannot APPEND with unknown input file size");
    CVar7 = CURLE_UPLOAD_FAILED;
    goto LAB_0013fc6f;
  }
  pcVar15 = imap_atom(pFVar3->freepath,false);
  if (pcVar15 == (char *)0x0) {
    CVar7 = CURLE_OUT_OF_MEMORY;
    goto LAB_0013fc6f;
  }
  Curl_dyn_init(&local_50,100);
  if ((data_00->set).upload_flags == '\0') {
    CVar9 = Curl_dyn_add(&local_50,"");
    CVar7 = CURLE_OK;
joined_r0x0013fbe9:
    if (CVar9 == CURLE_OK) {
      pcVar16 = Curl_dyn_ptr(&local_50);
      CVar7 = imap_sendf(data_00,"APPEND %s%s {%ld}",pcVar15,pcVar16,(data_00->state).infilesize);
    }
  }
  else {
    CVar9 = Curl_dyn_add(&local_50," (");
    CVar7 = CURLE_OUT_OF_MEMORY;
    if (CVar9 == CURLE_OK) {
      uVar10 = 1;
      lVar12 = 0x10;
      do {
        if (((uVar10 & (local_68->set).upload_flags) != 0) &&
           ((((sVar14 = Curl_dyn_len(&local_50), 2 < sVar14 &&
              (CVar9 = Curl_dyn_add(&local_50," "), data_00 = local_68, CVar9 != CURLE_OK)) ||
             (CVar9 = Curl_dyn_add(&local_50,"\\"), data_00 = local_68, CVar9 != CURLE_OK)) ||
            (CVar9 = Curl_dyn_add(&local_50,*(char **)((long)&saslimap.defmechs + lVar12)),
            data_00 = local_68, CVar9 != CURLE_OK)))) goto LAB_0013fc1d;
        uVar10 = *(uint *)(&DAT_001a3510 + lVar12);
        lVar12 = lVar12 + 0x10;
      } while (lVar12 != 0x60);
      CVar9 = Curl_dyn_add(&local_50,")");
      data_00 = local_68;
      goto joined_r0x0013fbe9;
    }
  }
LAB_0013fc1d:
  Curl_dyn_free(&local_50);
  (*Curl_cfree)(pcVar15);
  if (CVar7 == CURLE_OK) {
    (data_00->conn->proto).imapc.state = IMAP_APPEND;
  }
LAB_0013fc6f:
  if (CVar7 == CURLE_OK) {
    pcVar4 = data_00->conn;
    CVar7 = Curl_pp_statemach(data_00,&(pcVar4->proto).ftpc.pp,false,false);
    *local_58 = (pcVar4->proto).imapc.state == IMAP_STOP;
    Curl_conn_is_connected(conn,0);
  }
  if (CVar7 == CURLE_OK) {
    CVar7 = CURLE_OK;
    if ((*local_58 == true) && (((data_00->req).p.imap)->transfer != PPTRANSFER_BODY)) {
      Curl_xfer_setup_nop(data_00);
      CVar7 = CURLE_OK;
    }
  }
  return CVar7;
code_r0x0013f5a3:
  pcVar16 = pcVar16 + 1;
  sVar14 = sVar14 + 1;
  goto LAB_0013f591;
}

Assistant:

static CURLcode imap_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = imap_parse_url_path(data);
  if(result)
    return result;

  /* Parse the custom request */
  result = imap_parse_custom_request(data);
  if(result)
    return result;

  result = imap_regular_transfer(data, done);

  return result;
}